

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsC.cxx
# Opt level: O0

void __thiscall cmDependsC::ParseTransform(cmDependsC *this,string *xform)

{
  long lVar1;
  mapped_type *this_00;
  string local_60 [8];
  string value;
  string name;
  size_type pos;
  string *xform_local;
  cmDependsC *this_local;
  
  lVar1 = std::__cxx11::string::find((char *)xform,0x78acbd);
  if ((lVar1 != -1) && (lVar1 != 0)) {
    std::__cxx11::string::substr((ulong)((long)&value.field_2 + 8),(ulong)xform);
    std::__cxx11::string::substr((ulong)local_60,(ulong)xform);
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&this->TransformRules,(key_type *)((long)&value.field_2 + 8));
    std::__cxx11::string::operator=((string *)this_00,local_60);
    std::__cxx11::string::~string(local_60);
    std::__cxx11::string::~string((string *)(value.field_2._M_local_buf + 8));
  }
  return;
}

Assistant:

void cmDependsC::ParseTransform(std::string const& xform)
{
  // A transform rule is of the form SOME_MACRO(%)=value-with-%
  // We can simply separate with "(%)=".
  std::string::size_type pos = xform.find("(%)=");
  if (pos == std::string::npos || pos == 0) {
    return;
  }
  std::string name = xform.substr(0, pos);
  std::string value = xform.substr(pos + 4);
  this->TransformRules[name] = value;
}